

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerSafe::Resign(Error *__return_storage_ptr__,CommissionerSafe *this)

{
  promise<ot::commissioner::Error> local_78;
  function<void_(ot::commissioner::Error)> local_58;
  anon_class_8_1_ba1d6e0d local_38;
  anon_class_8_1_ba1d6e0d wait;
  promise<ot::commissioner::Error> pro;
  CommissionerSafe *this_local;
  
  std::promise<ot::commissioner::Error>::promise((promise<ot::commissioner::Error> *)&wait);
  local_38.pro = (promise<ot::commissioner::Error> *)&wait;
  std::function<void(ot::commissioner::Error)>::
  function<ot::commissioner::CommissionerSafe::Resign()::__0&,void>
            ((function<void(ot::commissioner::Error)> *)&local_58,&local_38);
  (*(this->super_Commissioner)._vptr_Commissioner[0xf])(this,&local_58);
  std::function<void_(ot::commissioner::Error)>::~function(&local_58);
  std::promise<ot::commissioner::Error>::get_future(&local_78);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_78);
  std::future<ot::commissioner::Error>::~future((future<ot::commissioner::Error> *)&local_78);
  std::promise<ot::commissioner::Error>::~promise((promise<ot::commissioner::Error> *)&wait);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::Resign()
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    Resign(wait);
    return pro.get_future().get();
}